

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  ostream *poVar3;
  TestPartResult *pTVar4;
  long *plVar5;
  string *value;
  TimeInMillis ms;
  pointer pcVar6;
  char *pcVar7;
  internal *this;
  int i;
  int iVar8;
  string location;
  string kIndent;
  string message;
  string kTestcase;
  string local_108;
  string local_e8;
  string local_c8;
  int local_a4;
  ostream *local_a0;
  TestResult *local_98;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70._M_allocated_capacity = (size_type)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"testcase","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_e8,'\n');
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_108,'\b');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"name","");
  std::__cxx11::string::string
            ((string *)&local_c8,(test_info->name_)._M_dataplus._M_p,(allocator *)local_90);
  OutputJsonKey(stream,(string *)&local_70,&local_108,&local_c8,&local_e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"value_param","");
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_c8,pcVar6,(allocator *)local_90);
    OutputJsonKey(stream,(string *)&local_70,&local_108,&local_c8,&local_e8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"type_param","");
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_c8,pcVar6,(allocator *)local_90);
    OutputJsonKey(stream,(string *)&local_70,&local_108,&local_c8,&local_e8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"status","");
  pcVar7 = "NOTRUN";
  if ((ulong)test_info->should_run_ != 0) {
    pcVar7 = "RUN";
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,pcVar7,pcVar7 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
  OutputJsonKey(stream,(string *)&local_70,&local_108,&local_c8,&local_e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            (&local_c8,(internal *)(test_info->result_).elapsed_time_,ms);
  OutputJsonKey(stream,(string *)&local_70,&local_108,&local_c8,&local_e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"classname","");
  value = &local_c8;
  std::__cxx11::string::string((string *)value,test_case_name,(allocator *)local_90);
  OutputJsonKey(stream,(string *)&local_70,&local_108,value,&local_e8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_98 = &test_info->result_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  TestPropertiesAsJson(&local_108,local_98,&local_e8);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_108._M_dataplus._M_p,local_108._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(test_info->result_).test_part_results_.
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar8 = 0;
    i = 0;
    local_a0 = stream;
    do {
      pTVar4 = TestResult::GetTestPartResult(local_98,i);
      iVar2 = (int)value;
      if (pTVar4->type_ != kSuccess) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        local_a4 = iVar8;
        if (iVar8 == 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,local_e8._M_dataplus._M_p,local_e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"failures",8);
          stream = local_a0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": [\n",5);
        }
        this = (internal *)(pTVar4->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar4->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_108,this,(char *)(ulong)(uint)pTVar4->line_number_,iVar2);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,local_108._M_dataplus._M_p,
                   local_108._M_dataplus._M_p + local_108._M_string_length);
        std::__cxx11::string::append((char *)local_50);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
        value = (string *)(plVar5 + 2);
        if ((string *)*plVar5 == value) {
          local_90._16_8_ = (value->_M_dataplus)._M_p;
          local_90._24_8_ = plVar5[3];
          local_90._0_8_ = (string *)(local_90 + 0x10);
        }
        else {
          local_90._16_8_ = (value->_M_dataplus)._M_p;
          local_90._0_8_ = (string *)*plVar5;
        }
        local_90._8_8_ = plVar5[1];
        *plVar5 = (long)value;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        EscapeJson(&local_c8,(string *)local_90);
        if ((string *)local_90._0_8_ != (string *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  {\n",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"failure\": \"",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\n",3);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"type\": \"\"\n",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  }",3);
        iVar8 = local_a4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        iVar8 = iVar8 + 1;
        stream = local_a0;
      }
      i = i + 1;
      iVar2 = (int)((ulong)((long)(test_info->result_).test_part_results_.
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(test_info->result_).test_part_results_.
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar2 * -0x49249249) != i + iVar2 * 0x49249249 < 0);
    if (0 < iVar8) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_108,'\b');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((char *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }

  OutputJsonKey(stream, kTestcase, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}